

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_alsa.c
# Opt level: O0

void alsa_stream_destroy(cubeb_stream_conflict1 *stm)

{
  long lVar1;
  int iVar2;
  long *in_RDI;
  cubeb_conflict1 *ctx;
  int r;
  uint in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff4;
  
  if ((in_RDI == (long *)0x0) ||
     ((((int)in_RDI[0x16] != 0 && ((int)in_RDI[0x16] != 4)) && ((int)in_RDI[0x16] != 2)))) {
    __assert_fail("stm && (stm->state == INACTIVE || stm->state == ERROR || stm->state == DRAINING)"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                  ,0x482,"void alsa_stream_destroy(cubeb_stream *)");
  }
  lVar1 = *in_RDI;
  if (in_RDI[0x22] != 0) {
    *(undefined8 *)(in_RDI[0x22] + 0x110) = 0;
    alsa_stream_destroy((cubeb_stream_conflict1 *)
                        CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
  }
  pthread_mutex_lock((pthread_mutex_t *)(in_RDI + 2));
  if (in_RDI[7] != 0) {
    if ((int)in_RDI[0x16] == 2) {
      (*cubeb_snd_pcm_drain)((snd_pcm_t *)in_RDI[7]);
    }
    alsa_locked_pcm_close
              ((snd_pcm_t *)CONCAT44(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0));
    in_RDI[7] = 0;
  }
  free((void *)in_RDI[0x17]);
  pthread_mutex_unlock((pthread_mutex_t *)(in_RDI + 2));
  pthread_mutex_destroy((pthread_mutex_t *)(in_RDI + 2));
  iVar2 = pthread_cond_destroy((pthread_cond_t *)(in_RDI + 0x10));
  if (iVar2 == 0) {
    alsa_unregister_stream((cubeb_stream_conflict1 *)(ulong)in_stack_fffffffffffffff0);
    pthread_mutex_lock((pthread_mutex_t *)(lVar1 + 0x18));
    if (*(int *)(lVar1 + 0xe0) != 0) {
      *(int *)(lVar1 + 0xe0) = *(int *)(lVar1 + 0xe0) + -1;
      pthread_mutex_unlock((pthread_mutex_t *)(lVar1 + 0x18));
      free((void *)in_RDI[0x1f]);
      free(in_RDI);
      return;
    }
    __assert_fail("ctx->active_streams >= 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                  ,0x49d,"void alsa_stream_destroy(cubeb_stream *)");
  }
  __assert_fail("r == 0",
                "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_alsa.c"
                ,0x498,"void alsa_stream_destroy(cubeb_stream *)");
}

Assistant:

static void
alsa_stream_destroy(cubeb_stream * stm)
{
  int r;
  cubeb * ctx;

  assert(stm && (stm->state == INACTIVE || stm->state == ERROR ||
                 stm->state == DRAINING));

  ctx = stm->context;

  if (stm->other_stream) {
    stm->other_stream->other_stream = NULL; // to stop infinite recursion
    alsa_stream_destroy(stm->other_stream);
  }

  pthread_mutex_lock(&stm->mutex);
  if (stm->pcm) {
    if (stm->state == DRAINING) {
      WRAP(snd_pcm_drain)(stm->pcm);
    }
    alsa_locked_pcm_close(stm->pcm);
    stm->pcm = NULL;
  }
  free(stm->saved_fds);
  pthread_mutex_unlock(&stm->mutex);
  pthread_mutex_destroy(&stm->mutex);

  r = pthread_cond_destroy(&stm->cond);
  assert(r == 0);

  alsa_unregister_stream(stm);

  pthread_mutex_lock(&ctx->mutex);
  assert(ctx->active_streams >= 1);
  ctx->active_streams -= 1;
  pthread_mutex_unlock(&ctx->mutex);

  free(stm->buffer);

  free(stm);
}